

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

void __thiscall
bgui::ImageAdapter<unsigned_char>::copyInto
          (ImageAdapter<unsigned_char> *this,ImageU8 *rgb,long x,long y)

{
  mapping mVar1;
  uint ig;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  uint uVar3;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar4;
  int k;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double b;
  double g;
  double r;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  uint local_8c;
  double local_88;
  double local_80;
  double local_78;
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = 1.0;
  local_80 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_88 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  pIVar4 = this->image;
  lVar5 = pIVar4->width;
  lVar6 = pIVar4->height;
  local_50 = y;
  if (0.0 < local_88) {
    dVar8 = log(local_88);
    dVar8 = floor(dVar8 / 2.302585092994046);
    local_68 = pow(10.0,dVar8 + -1.0);
    pIVar4 = this->image;
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar6 = pIVar4->width;
    lVar5 = pIVar4->height;
  }
  uVar3 = (uint)(2 < pIVar4->depth);
  local_8c = (this->super_ImageAdapterBase).channel;
  ig = local_8c;
  local_6c = local_8c;
  if ((int)local_8c < 0 || pIVar4->depth <= (int)local_8c) {
    local_8c = 0;
    ig = uVar3;
    local_6c = uVar3 * 2;
  }
  local_58 = (double)lVar6;
  local_60 = (double)x;
  local_78 = (double)lVar5;
  lVar5 = 0;
  dVar8 = local_80;
  do {
    if (rgb->height <= lVar5) {
      return;
    }
    dVar15 = (this->super_ImageAdapterBase).scale;
    dVar14 = (double)(local_50 + lVar5) / dVar15;
    if (dVar14 < 0.0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      if (dVar14 < local_58) {
        dVar15 = local_60 / dVar15;
        for (uVar7 = 0; (dVar15 < 0.0 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
          (*rgb->img)[lVar5][uVar7] = '\0';
          rgb->img[1][lVar5][uVar7] = '\0';
          rgb->img[2][lVar5][uVar7] = '\0';
          dVar15 = dVar15 + dVar8;
        }
        if ((ig == local_8c) && (mVar1 = (this->super_ImageAdapterBase).map, mVar1 != map_raw)) {
          if (mVar1 == map_jet) {
            for (; (dVar15 < local_78 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
              dVar9 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                           (double)(this->super_ImageAdapterBase).R.v[0][0] * dVar15
                                           + (double)(this->super_ImageAdapterBase).R.v[0][1] *
                                             dVar14),
                               (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                      (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar15 +
                                      (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar14),ig)
              ;
              dVar8 = (this->super_ImageAdapterBase).imin;
              dVar12 = -0.05;
              iVar2 = extraout_EAX;
              if ((dVar8 <= dVar9) && (dVar12 = 1.05, dVar9 <= (this->super_ImageAdapterBase).imax))
              {
                dVar12 = (dVar9 - dVar8) / local_88;
                dVar8 = (this->super_ImageAdapterBase).gamma;
                if ((dVar8 != 1.0) || (NAN(dVar8))) {
                  iVar2 = (int)(dVar8 + 0.5);
                  if (iVar2 == 2) {
                    if (dVar12 < 0.0) {
                      dVar12 = sqrt(dVar12);
                      iVar2 = extraout_EAX_00;
                    }
                    else {
                      dVar12 = SQRT(dVar12);
                    }
                  }
                  else if (2 < iVar2) {
                    dVar12 = 0.0;
                  }
                }
              }
              dVar8 = dVar12 / 1.15 + 0.1;
              dVar9 = ABS(dVar8 + -0.75) * -4.0 + 1.5;
              if (1.0 <= dVar9) {
                dVar9 = 1.0;
              }
              auVar10._0_8_ = ABS(dVar8 + -0.25) * -4.0 + 1.5;
              auVar10._8_8_ = ABS(dVar8 + -0.5) * -4.0 + 1.5;
              auVar11 = minpd(auVar10,_DAT_0011c1b0);
              dVar8 = auVar11._0_8_;
              dVar12 = auVar11._8_8_;
              auVar11._8_8_ = -(ulong)(0.0 < dVar12);
              auVar11._0_8_ = -(ulong)(0.0 < dVar8);
              uVar3 = movmskpd(iVar2,auVar11);
              if ((uVar3 & 2) == 0) {
                dVar12 = 0.0;
              }
              if ((uVar3 & 1) == 0) {
                dVar8 = 0.0;
              }
              if (dVar9 <= 0.0) {
                dVar9 = 0.0;
              }
              (*rgb->img)[lVar5][uVar7] = (uchar)(int)(dVar9 * 255.0 + 0.5);
              rgb->img[1][lVar5][uVar7] = (uchar)(int)(dVar12 * 255.0 + 0.5);
              rgb->img[2][lVar5][uVar7] = (uchar)(int)(dVar8 * 255.0 + 0.5);
              dVar15 = dVar15 + local_80;
              dVar8 = local_80;
            }
          }
          else if (mVar1 == map_rainbow) {
            for (; (dVar15 < local_78 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
              dVar9 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                           (double)(this->super_ImageAdapterBase).R.v[0][0] * dVar15
                                           + (double)(this->super_ImageAdapterBase).R.v[0][1] *
                                             dVar14),
                               (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                      (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar15 +
                                      (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar14),ig)
              ;
              local_a8 = (this->super_ImageAdapterBase).imin;
              local_a0 = (this->super_ImageAdapterBase).imax;
              dVar8 = local_a8;
              if (local_a8 <= dVar9) {
                dVar8 = dVar9;
              }
              if (dVar8 <= local_a0) {
                local_a0 = dVar8;
              }
              local_48 = local_a0 / local_68;
              uStack_40 = 0;
              dVar8 = floor(local_48);
              dVar12 = (local_48 - dVar8) * 6.0;
              dVar9 = dVar12 - (double)(int)dVar12;
              dVar8 = 0.0;
              switch((int)dVar12) {
              case 0:
                dVar12 = 1.0;
                break;
              case 1:
                dVar12 = 1.0 - dVar9;
                dVar9 = 1.0;
                break;
              case 2:
                dVar12 = 0.0;
                dVar8 = dVar9;
                dVar9 = 1.0;
                break;
              case 3:
                dVar12 = 0.0;
                dVar8 = 1.0;
                dVar9 = 1.0 - dVar9;
                break;
              case 4:
                dVar12 = dVar9;
                dVar8 = 1.0;
                dVar9 = 0.0;
                break;
              default:
                dVar12 = 1.0;
                dVar8 = 1.0 - dVar9;
                dVar9 = 0.0;
              }
              dVar16 = ((local_a0 - local_a8) * 1.6) / local_88 + -0.8;
              if (0.0 <= dVar16) {
                dVar13 = 1.0 - dVar16;
                dVar12 = dVar12 * dVar13 + dVar16;
                dVar9 = dVar9 * dVar13 + dVar16;
                dVar16 = dVar16 + dVar13 * dVar8;
              }
              else {
                dVar16 = dVar16 + 1.0;
                dVar12 = dVar12 * dVar16;
                dVar9 = dVar9 * dVar16;
                dVar16 = dVar16 * dVar8;
              }
              (*rgb->img)[lVar5][uVar7] = (uchar)(int)(dVar12 * 255.0 + 0.5);
              rgb->img[1][lVar5][uVar7] = (uchar)(int)(dVar9 * 255.0 + 0.5);
              rgb->img[2][lVar5][uVar7] = (uchar)(int)(dVar16 * 255.0 + 0.5);
              dVar15 = dVar15 + local_80;
              dVar8 = local_80;
            }
          }
        }
        else {
          for (; (dVar15 < local_78 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
            getPixel(this,&local_98,&local_b0,&local_b8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * dVar15 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * dVar14),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar15 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar14),local_8c,ig,
                     local_6c);
            dVar8 = (this->super_ImageAdapterBase).imin;
            dVar9 = (this->super_ImageAdapterBase).imax;
            if (dVar9 <= local_98) {
              local_98 = dVar9;
            }
            if (local_98 <= dVar8) {
              local_98 = dVar8;
            }
            local_98 = (local_98 - dVar8) / local_88;
            if (dVar9 <= local_b0) {
              local_b0 = dVar9;
            }
            if (local_b0 <= dVar8) {
              local_b0 = dVar8;
            }
            local_b0 = (local_b0 - dVar8) / local_88;
            if (dVar9 <= local_b8) {
              local_b8 = dVar9;
            }
            if (local_b8 <= dVar8) {
              local_b8 = dVar8;
            }
            local_b8 = (local_b8 - dVar8) / local_88;
            dVar8 = (this->super_ImageAdapterBase).gamma;
            if ((dVar8 != 1.0) || (NAN(dVar8))) {
              if ((int)(dVar8 + 0.5) == 2) {
                if (local_98 < 0.0) {
                  local_98 = sqrt(local_98);
                }
                else {
                  local_98 = SQRT(local_98);
                }
                if (local_b0 < 0.0) {
                  local_b0 = sqrt(local_b0);
                  dVar8 = local_b8;
                }
                else {
                  local_b0 = SQRT(local_b0);
                  dVar8 = local_b8;
                }
              }
              else {
                if ((int)(dVar8 + 0.5) < 3) goto LAB_00111327;
                if (local_98 < 0.0) {
                  dVar8 = sqrt(local_98);
                }
                else {
                  dVar8 = SQRT(local_98);
                }
                if (dVar8 < 0.0) {
                  local_98 = sqrt(dVar8);
                }
                else {
                  local_98 = SQRT(dVar8);
                }
                if (local_b0 < 0.0) {
                  dVar8 = sqrt(local_b0);
                }
                else {
                  dVar8 = SQRT(local_b0);
                }
                if (dVar8 < 0.0) {
                  local_b0 = sqrt(dVar8);
                }
                else {
                  local_b0 = SQRT(dVar8);
                }
                if (local_b8 < 0.0) {
                  dVar8 = sqrt(local_b8);
                }
                else {
                  dVar8 = SQRT(local_b8);
                }
              }
              if (dVar8 < 0.0) {
                local_b8 = sqrt(dVar8);
              }
              else {
                local_b8 = SQRT(dVar8);
              }
            }
LAB_00111327:
            (*rgb->img)[lVar5][uVar7] = (uchar)(int)(local_98 * 255.0 + 0.5);
            rgb->img[1][lVar5][uVar7] = (uchar)(int)(local_b0 * 255.0 + 0.5);
            rgb->img[2][lVar5][uVar7] = (uchar)(int)(local_b8 * 255.0 + 0.5);
            dVar15 = dVar15 + local_80;
            dVar8 = local_80;
          }
        }
      }
    }
    for (uVar7 = uVar7 & 0xffffffff; (long)uVar7 < rgb->width; uVar7 = uVar7 + 1) {
      (*rgb->img)[lVar5][uVar7] = '\0';
      rgb->img[1][lVar5][uVar7] = '\0';
      rgb->img[2][lVar5][uVar7] = '\0';
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }